

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_lock.c
# Opt level: O2

void IntCManager_unlock(CManager cm,char *file,int line)

{
  FILE *__stream;
  __pid_t _Var1;
  pthread_t pVar2;
  int iVar3;
  timespec ts;
  
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(cm,CMLowLevelVerbose);
    if (iVar3 == 0) goto LAB_0012325f;
  }
  else if (CMtrace_val[3] == 0) goto LAB_0012325f;
  if (CMtrace_PID != 0) {
    __stream = (FILE *)cm->CMTrace_file;
    _Var1 = getpid();
    pVar2 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var1,pVar2);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,(timespec *)&ts);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
  }
  fprintf((FILE *)cm->CMTrace_file,"CManager Unlock at \"%s\" line %d\n",file,(ulong)(uint)line);
LAB_0012325f:
  fflush((FILE *)cm->CMTrace_file);
  iVar3 = cm->locked + -1;
  cm->locked = iVar3;
  if (iVar3 != 0) {
    printf("CManager unlock inconsistency, %d\n");
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cm->exchange_lock);
  return;
}

Assistant:

extern void
IntCManager_unlock(CManager cm, const char *file, int line)
{
    CMtrace_out(cm, CMLowLevelVerbose, "CManager Unlock at \"%s\" line %d\n",
		file, line);
    cm->locked--;
    if (cm->locked != 0) {
	printf("CManager unlock inconsistency, %d\n", cm->locked);
    }
    thr_mutex_unlock(cm->exchange_lock);
}